

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O0

entry_t_conflict * entry_prev(entry_t_conflict *entry)

{
  bool bVar1;
  entry_t_conflict *local_20;
  entry_t_conflict *prev;
  entry_t_conflict *entry_local;
  
  if (entry == (entry_t_conflict *)0x0) {
    entry_local = (entry_t_conflict *)0x0;
  }
  else if (entry->left == (coll_tmap_entry_t *)0x0) {
    prev = entry->parent;
    local_20 = entry;
    while( true ) {
      bVar1 = false;
      if (prev != (entry_t_conflict *)0x0) {
        bVar1 = prev->left == local_20;
      }
      if (!bVar1) break;
      local_20 = prev;
      prev = prev->parent;
    }
    entry_local = prev;
  }
  else {
    for (prev = entry->left; prev->right != (coll_tmap_entry_t *)0x0; prev = prev->right) {
    }
    entry_local = prev;
  }
  return entry_local;
}

Assistant:

static entry_t *entry_prev(entry_t *entry) {
    if (!entry) {
        return NULL;
    }
    if (entry->left) {
        entry = entry->left;
        while (entry->right) {
            entry = entry->right;
        }
        return entry;
    }
    entry_t *prev = entry;
    entry = entry->parent;
    while (entry && entry->left == prev) {
        prev = entry;
        entry = entry->parent;
    }
    return entry;
}